

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O3

bool bssl::ssl_parse_cert_chain
               (uint8_t *out_alert,UniquePtr<struct_stack_st_CRYPTO_BUFFER> *out_chain,
               UniquePtr<EVP_PKEY> *out_pubkey,uint8_t *out_leaf_sha256,CBS *cbs,
               CRYPTO_BUFFER_POOL *pool)

{
  _Head_base<0UL,_evp_pkey_st_*,_false> _Var1;
  int iVar2;
  size_t sVar3;
  EVP_PKEY *p;
  _Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false> __p;
  bool bVar4;
  UniquePtr<CRYPTO_BUFFER> buf;
  UniquePtr<EVP_PKEY> pubkey;
  UniquePtr<struct_stack_st_CRYPTO_BUFFER> chain;
  CBS certificate_list;
  CBS certificate;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_70;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_68;
  _Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false> local_60;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_58;
  CBS local_50;
  CBS local_40;
  
  std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)out_chain,
             (pointer)0x0);
  std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)out_pubkey,(pointer)0x0);
  iVar2 = CBS_get_u24_length_prefixed(cbs,&local_50);
  if (iVar2 == 0) {
    *out_alert = '2';
    bVar4 = false;
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                  ,0x85);
  }
  else if (local_50.len == 0) {
    bVar4 = true;
  }
  else {
    local_60._M_head_impl = (stack_st_CRYPTO_BUFFER *)OPENSSL_sk_new_null();
    if ((OPENSSL_STACK *)local_60._M_head_impl == (OPENSSL_STACK *)0x0) {
      *out_alert = 'P';
      bVar4 = false;
    }
    else {
      local_68._M_head_impl = (evp_pkey_st *)0x0;
      __p._M_head_impl = local_60._M_head_impl;
      if (local_50.len != 0) {
        do {
          iVar2 = CBS_get_u24_length_prefixed(&local_50,&local_40);
          if ((iVar2 == 0) || (local_40.len == 0)) {
            *out_alert = '2';
            ERR_put_error(0x10,0,0x7f,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                          ,0x99);
LAB_00150f7a:
            bVar4 = false;
            goto LAB_00150f7c;
          }
          sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)local_60._M_head_impl);
          if (sVar3 == 0) {
            ssl_cert_parse_pubkey((bssl *)&local_70,&local_40);
            _Var1._M_head_impl = local_68._M_head_impl;
            local_68._M_head_impl = local_70._M_head_impl;
            local_70._M_head_impl = (evp_pkey_st *)0x0;
            if ((EVP_PKEY *)_Var1._M_head_impl != (EVP_PKEY *)0x0) {
              EVP_PKEY_free((EVP_PKEY *)_Var1._M_head_impl);
            }
            std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_70);
            if ((EVP_PKEY *)local_68._M_head_impl == (EVP_PKEY *)0x0) {
              *out_alert = '2';
              goto LAB_00150f7a;
            }
            if (out_leaf_sha256 != (uint8_t *)0x0) {
              SHA256(local_40.data,local_40.len,out_leaf_sha256);
            }
          }
          p = (EVP_PKEY *)CRYPTO_BUFFER_new_from_CBS(&local_40,pool);
          local_70._M_head_impl = (evp_pkey_st *)p;
          if (p == (EVP_PKEY *)0x0) {
LAB_00150f6c:
            *out_alert = 'P';
            std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_70);
            goto LAB_00150f7a;
          }
          local_70._M_head_impl = (evp_pkey_st *)0x0;
          local_58._M_head_impl = (evp_pkey_st *)p;
          sVar3 = OPENSSL_sk_push((OPENSSL_STACK *)local_60._M_head_impl,p);
          if (sVar3 == 0) {
            std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_58);
            goto LAB_00150f6c;
          }
          local_58._M_head_impl = (evp_pkey_st *)0x0;
          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_58);
          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_70);
          __p._M_head_impl = local_60._M_head_impl;
        } while (local_50.len != 0);
      }
      local_60._M_head_impl = (stack_st_CRYPTO_BUFFER *)0x0;
      std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)out_chain,
                 __p._M_head_impl);
      _Var1._M_head_impl = local_68._M_head_impl;
      local_68._M_head_impl = (evp_pkey_st *)0x0;
      std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)out_pubkey,
                 _Var1._M_head_impl);
      bVar4 = true;
LAB_00150f7c:
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_68);
    }
    std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)&local_60);
  }
  return bVar4;
}

Assistant:

bool ssl_parse_cert_chain(uint8_t *out_alert,
                          UniquePtr<STACK_OF(CRYPTO_BUFFER)> *out_chain,
                          UniquePtr<EVP_PKEY> *out_pubkey,
                          uint8_t *out_leaf_sha256, CBS *cbs,
                          CRYPTO_BUFFER_POOL *pool) {
  out_chain->reset();
  out_pubkey->reset();

  CBS certificate_list;
  if (!CBS_get_u24_length_prefixed(cbs, &certificate_list)) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  if (CBS_len(&certificate_list) == 0) {
    return true;
  }

  UniquePtr<STACK_OF(CRYPTO_BUFFER)> chain(sk_CRYPTO_BUFFER_new_null());
  if (!chain) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  UniquePtr<EVP_PKEY> pubkey;
  while (CBS_len(&certificate_list) > 0) {
    CBS certificate;
    if (!CBS_get_u24_length_prefixed(&certificate_list, &certificate) ||
        CBS_len(&certificate) == 0) {
      *out_alert = SSL_AD_DECODE_ERROR;
      OPENSSL_PUT_ERROR(SSL, SSL_R_CERT_LENGTH_MISMATCH);
      return false;
    }

    if (sk_CRYPTO_BUFFER_num(chain.get()) == 0) {
      pubkey = ssl_cert_parse_pubkey(&certificate);
      if (!pubkey) {
        *out_alert = SSL_AD_DECODE_ERROR;
        return false;
      }

      // Retain the hash of the leaf certificate if requested.
      if (out_leaf_sha256 != NULL) {
        SHA256(CBS_data(&certificate), CBS_len(&certificate), out_leaf_sha256);
      }
    }

    UniquePtr<CRYPTO_BUFFER> buf(
        CRYPTO_BUFFER_new_from_CBS(&certificate, pool));
    if (!buf ||  //
        !PushToStack(chain.get(), std::move(buf))) {
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return false;
    }
  }

  *out_chain = std::move(chain);
  *out_pubkey = std::move(pubkey);
  return true;
}